

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
xla::GraphCycles::AllNodesInPostOrder
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GraphCycles *this)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  iterator __position;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong in_R8;
  long lVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oneapi_src[P]level_zero_third_party_xla_graphcycles_cc:505:47)>
  __comp;
  int32_t index;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> free_nodes_set;
  int local_64;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_R8;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<int*,std::insert_iterator<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,(int *)&local_60,
             (insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
              )(auVar3 << 0x40));
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->rep_->nodes_).
                    super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->rep_->nodes_).
                    super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - local_60._M_element_count);
  __comp._M_comp.nodes = (anon_class_8_1_a85c01d1)this->rep_;
  lVar5 = (long)(((_Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   *)&(((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                         *)__comp._M_comp.nodes)->
                      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                      )._M_impl)->_M_impl).super__Vector_impl_data._M_finish -
          (long)(((_Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   *)&(((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                         *)__comp._M_comp.nodes)->
                      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                      )._M_impl)->_M_impl).super__Vector_impl_data._M_start >> 3;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      local_64 = (int)lVar6;
      if (local_60._M_buckets[(ulong)(long)local_64 % local_60._M_bucket_count] !=
          (__node_base_ptr)0x0) {
        p_Var2 = local_60._M_buckets[(ulong)(long)local_64 % local_60._M_bucket_count]->_M_nxt;
        iVar1 = *(int *)&p_Var2[1]._M_nxt;
        do {
          if (iVar1 == local_64) goto LAB_0019919f;
          p_Var2 = p_Var2->_M_nxt;
        } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                (iVar1 = *(int *)&p_Var2[1]._M_nxt,
                (ulong)(long)iVar1 % local_60._M_bucket_count ==
                (ulong)(long)local_64 % local_60._M_bucket_count));
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_64);
      }
      else {
        *__position._M_current = local_64;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_0019919f:
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
    __comp._M_comp.nodes = (anon_class_8_1_a85c01d1)this->rep_;
  }
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar4 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<xla::(anonymous_namespace)::SortInPostOrder(std::vector<xla::(anonymous_namespace)::Node,std::allocator<xla::(anonymous_namespace)::Node>>const&,std::vector<int,std::allocator<int>>*)::__0>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oneapi_src[P]level_zero_third_party_xla_graphcycles_cc:505:47)>
                )__comp._M_comp.nodes);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<xla::(anonymous_namespace)::SortInPostOrder(std::vector<xla::(anonymous_namespace)::Node,std::allocator<xla::(anonymous_namespace)::Node>>const&,std::vector<int,std::allocator<int>>*)::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oneapi_src[P]level_zero_third_party_xla_graphcycles_cc:505:47)>
                  )__comp._M_comp.nodes);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<xla::(anonymous_namespace)::SortInPostOrder(std::vector<xla::(anonymous_namespace)::Node,std::allocator<xla::(anonymous_namespace)::Node>>const&,std::vector<int,std::allocator<int>>*)::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oneapi_src[P]level_zero_third_party_xla_graphcycles_cc:505:47)>
                  )__comp._M_comp.nodes);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<xla::(anonymous_namespace)::SortInPostOrder(std::vector<xla::(anonymous_namespace)::Node,std::allocator<xla::(anonymous_namespace)::Node>>const&,std::vector<int,std::allocator<int>>*)::__0>>
                  (__last_00,__comp);
      }
    }
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> GraphCycles::AllNodesInPostOrder() const {
  std::unordered_set<int32_t> free_nodes_set;
  std::copy(rep_->free_nodes_.begin(), rep_->free_nodes_.end(),
            std::inserter(free_nodes_set, free_nodes_set.begin()));

  std::vector<int32_t> all_nodes;
  all_nodes.reserve(rep_->nodes_.size() - free_nodes_set.size());

  for (int64_t i = 0, e = rep_->nodes_.size(); i < e; i++) {
    int32_t index = static_cast<int32_t>(i);
    if (!contains(free_nodes_set, index)) {
      all_nodes.push_back(index);
    }
  }

  SortInPostOrder(rep_->nodes_, &all_nodes);
  return all_nodes;
}